

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O1

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxNode *args_2;
  Delay3Syntax *pDVar1;
  DeepCloneVisitor visitor_1;
  SyntaxNode *local_70;
  Token local_68;
  Token local_58;
  DeepCloneVisitor visitor_2;
  SyntaxNode *local_38;
  DeepCloneVisitor visitor;
  
  local_58 = parsing::Token::deepClone((Token *)(__fn + 0x18),(BumpAllocator *)__child_stack);
  local_68 = parsing::Token::deepClone((Token *)(__fn + 0x28),(BumpAllocator *)__child_stack);
  args_2 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x38),&visitor,(BumpAllocator *)__child_stack);
  _visitor = parsing::Token::deepClone((Token *)(__fn + 0x40),(BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0x50) == (SyntaxNode *)0x0) {
    local_70 = (SyntaxNode *)0x0;
  }
  else {
    local_70 = detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x50),&visitor_1,(BumpAllocator *)__child_stack);
  }
  _visitor_1 = parsing::Token::deepClone((Token *)(__fn + 0x58),(BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0x68) == (SyntaxNode *)0x0) {
    local_38 = (SyntaxNode *)0x0;
  }
  else {
    local_38 = detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x68),&visitor_2,(BumpAllocator *)__child_stack);
  }
  _visitor_2 = parsing::Token::deepClone((Token *)(__fn + 0x70),(BumpAllocator *)__child_stack);
  pDVar1 = BumpAllocator::
           emplace<slang::syntax::Delay3Syntax,slang::parsing::Token,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::syntax::ExpressionSyntax*,slang::parsing::Token,slang::syntax::ExpressionSyntax*,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,&local_58,&local_68,(ExpressionSyntax *)args_2,
                      (Token *)&visitor,(ExpressionSyntax **)&local_70,(Token *)&visitor_1,
                      (ExpressionSyntax **)&local_38,(Token *)&visitor_2);
  return (int)pDVar1;
}

Assistant:

static SyntaxNode* clone(const Delay3Syntax& node, BumpAllocator& alloc) {
    return alloc.emplace<Delay3Syntax>(
        node.hash.deepClone(alloc),
        node.openParen.deepClone(alloc),
        *deepClone<ExpressionSyntax>(*node.delay1, alloc),
        node.comma1.deepClone(alloc),
        node.delay2 ? deepClone(*node.delay2, alloc) : nullptr,
        node.comma2.deepClone(alloc),
        node.delay3 ? deepClone(*node.delay3, alloc) : nullptr,
        node.closeParen.deepClone(alloc)
    );
}